

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_1_12_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  float *pfVar22;
  int iVar23;
  float *data;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  long lVar33;
  float *pfVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  float *pfVar42;
  int k_count;
  bool bVar43;
  byte bVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 in_ZmmResult [64];
  undefined1 auVar60 [64];
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar84 [12];
  undefined1 auVar83 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar85 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar86 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 in_ZMM14 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  int l_count0_1;
  int l0_1;
  int l0;
  int data_width;
  int l_count0;
  float local_c8;
  
  auVar51._8_4_ = 0x80000000;
  auVar51._0_8_ = 0x8000000080000000;
  auVar51._12_4_ = 0x80000000;
  auVar52._8_4_ = 0x3effffff;
  auVar52._0_8_ = 0x3effffff3effffff;
  auVar52._12_4_ = 0x3effffff;
  auVar92._16_48_ = in_ZMM18._16_48_;
  auVar92._0_16_ = ZEXT416((uint)ipoint->scale);
  auVar60._16_48_ = in_ZmmResult._16_48_;
  auVar45 = vpternlogd_avx512vl(auVar52,auVar92._0_16_,auVar51,0xf8);
  auVar45 = vaddss_avx512f(auVar92._0_16_,auVar45);
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  iVar39 = (int)auVar45._0_4_;
  auVar46 = vmulss_avx512f(auVar92._0_16_,auVar92._0_16_);
  fVar61 = -0.08 / auVar46._0_4_;
  auVar46 = vpternlogd_avx512vl(auVar52,ZEXT416((uint)ipoint->x),auVar51,0xf8);
  auVar46 = ZEXT416((uint)(ipoint->x + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar49._0_8_ = (double)auVar46._0_4_;
  auVar49._8_8_ = auVar46._8_8_;
  auVar60._0_16_ = vcvtss2sd_avx512f(auVar92._0_16_,auVar92._0_16_);
  auVar93._0_8_ = auVar60._0_8_;
  auVar93._8_56_ = auVar60._8_56_;
  auVar46 = vfmadd231sd_fma(auVar49,auVar93._0_16_,ZEXT816(0x3fe0000000000000));
  auVar50._0_4_ = (float)auVar46._0_8_;
  auVar50._4_12_ = auVar46._4_12_;
  auVar46 = vpternlogd_avx512vl(auVar52,ZEXT416((uint)ipoint->y),auVar51,0xf8);
  auVar46 = ZEXT416((uint)(ipoint->y + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47._0_8_ = (double)auVar46._0_4_;
  auVar47._8_8_ = auVar46._8_8_;
  auVar46 = vfmadd231sd_fma(auVar47,auVar93._0_16_,ZEXT816(0x3fe0000000000000));
  auVar48._0_4_ = (float)auVar46._0_8_;
  auVar48._4_12_ = auVar46._4_12_;
  auVar46._0_4_ = (int)auVar45._0_4_;
  auVar46._4_4_ = (int)auVar45._4_4_;
  auVar46._8_4_ = (int)auVar45._8_4_;
  auVar46._12_4_ = (int)auVar45._12_4_;
  auVar45 = vcvtdq2ps_avx(auVar46);
  fVar63 = auVar50._0_4_ - auVar45._0_4_;
  auVar49 = ZEXT416((uint)fVar63);
  fVar2 = auVar48._0_4_ - auVar45._0_4_;
  auVar45 = vfmadd213ss_avx512f(SUB6416(ZEXT464(0xc1400000),0),auVar92._0_16_,auVar50);
  auVar46 = vpternlogd_avx512vl(auVar52,auVar45,auVar51,0xf8);
  auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar46._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  if (iVar39 < (int)auVar45._0_4_) {
    auVar45 = vfmadd213ss_avx512f(SUB6416(ZEXT464(0xc1400000),0),auVar92._0_16_,auVar48);
    auVar53._8_4_ = 0x3effffff;
    auVar53._0_8_ = 0x3effffff3effffff;
    auVar53._12_4_ = 0x3effffff;
    auVar54._8_4_ = 0x80000000;
    auVar54._0_8_ = 0x8000000080000000;
    auVar54._12_4_ = 0x80000000;
    auVar46 = vpternlogd_avx512vl(auVar54,auVar45,auVar53,0xea);
    auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar46._0_4_));
    auVar45 = vroundss_avx(auVar45,auVar45,0xb);
    if (iVar39 < (int)auVar45._0_4_) {
      auVar45 = vfmadd231ss_avx512f(auVar50,auVar92._0_16_,ZEXT416(0x41300000));
      auVar55._8_4_ = 0x80000000;
      auVar55._0_8_ = 0x8000000080000000;
      auVar55._12_4_ = 0x80000000;
      auVar46 = vpternlogd_avx512vl(auVar55,auVar45,auVar53,0xea);
      auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar46._0_4_));
      auVar45 = vroundss_avx(auVar45,auVar45,0xb);
      if ((int)auVar45._0_4_ + iVar39 <= iimage->width) {
        auVar46 = vfmadd231ss_avx512f(auVar48,auVar92._0_16_,ZEXT416(0x41300000));
        auVar45._8_4_ = 0x80000000;
        auVar45._0_8_ = 0x8000000080000000;
        auVar45._12_4_ = 0x80000000;
        auVar45 = vpternlogd_avx512vl(auVar53,auVar46,auVar45,0xf8);
        auVar45 = ZEXT416((uint)(auVar46._0_4_ + auVar45._0_4_));
        auVar45 = vroundss_avx(auVar45,auVar45,0xb);
        if ((int)auVar45._0_4_ + iVar39 <= iimage->height) {
          fVar63 = fVar63 + 0.5;
          pfVar34 = iimage->data;
          iVar1 = iimage->data_width;
          iVar13 = iVar39 * 2;
          pfVar22 = haarResponseY + 0xb;
          pfVar42 = haarResponseX + 0xb;
          iVar30 = -0xc;
          lVar19 = 0;
          do {
            auVar56._0_4_ = (float)iVar30;
            auVar56._4_12_ = in_ZMM9._4_12_;
            auVar45 = vfmadd213ss_avx512f(auVar56,auVar92._0_16_,ZEXT416((uint)(fVar2 + 0.5)));
            iVar14 = (int)auVar45._0_4_;
            iVar15 = (iVar14 + -1) * iVar1;
            iVar16 = (iVar14 + -1 + iVar39) * iVar1;
            iVar14 = (iVar14 + -1 + iVar13) * iVar1;
            lVar27 = 0;
            do {
              iVar23 = (int)lVar27;
              auVar57._0_4_ = (float)(iVar23 + -0xc);
              auVar57._4_12_ = in_ZMM10._4_12_;
              auVar45 = vfmadd213ss_avx512f(auVar57,auVar92._0_16_,ZEXT416((uint)fVar63));
              iVar29 = (int)auVar45._0_4_;
              auVar91._0_4_ = (float)(iVar23 + -0xb);
              auVar85._4_12_ = in_ZMM9._4_12_;
              auVar91._4_12_ = auVar85._4_12_;
              auVar45 = vfmadd213ss_avx512f(auVar91,auVar92._0_16_,ZEXT416((uint)fVar63));
              auVar89._0_4_ = (float)(iVar23 + -10);
              auVar89._4_12_ = auVar85._4_12_;
              auVar87._0_4_ = (float)(iVar23 + -9);
              auVar87._4_12_ = auVar85._4_12_;
              auVar86._0_4_ = (float)(iVar23 + -8);
              auVar86._4_12_ = auVar85._4_12_;
              auVar85._0_4_ = (float)(iVar23 + -7);
              auVar83._0_4_ = (float)(iVar23 + -6);
              auVar84 = in_ZMM14._4_12_;
              auVar83._4_12_ = auVar84;
              auVar82._0_4_ = (float)(iVar23 + -5);
              auVar82._4_12_ = auVar84;
              auVar80._0_4_ = (float)(iVar23 + -4);
              auVar80._4_12_ = auVar84;
              auVar79._0_4_ = (float)(iVar23 + -3);
              auVar79._4_12_ = auVar84;
              auVar76._0_4_ = (float)(iVar23 + -2);
              auVar76._4_12_ = auVar84;
              auVar74._0_4_ = (float)(iVar23 + -1);
              auVar74._4_12_ = auVar84;
              iVar40 = iVar29 + -1 + iVar39;
              iVar37 = iVar29 + -1 + iVar13;
              fVar62 = pfVar34[iVar16 + -1 + iVar29];
              iVar17 = (int)auVar45._0_4_;
              auVar48 = ZEXT416((uint)fVar63);
              auVar46 = vfmadd213ss_avx512f(auVar89,auVar92._0_16_,auVar48);
              auVar49 = vsubss_avx512f(ZEXT416((uint)pfVar34[iVar37 + iVar14]),
                                       ZEXT416((uint)pfVar34[iVar15 + -1 + iVar29]));
              auVar47 = vsubss_avx512f(ZEXT416((uint)pfVar34[iVar14 + -1 + iVar29]),
                                       ZEXT416((uint)pfVar34[iVar15 + iVar37]));
              auVar50 = SUB6416(ZEXT464(0x40000000),0);
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar15 + iVar40] -
                                                      pfVar34[iVar40 + iVar14])),auVar50,auVar49);
              auVar45 = vaddss_avx512f(auVar47,auVar45);
              fVar67 = pfVar34[iVar16 + iVar37];
              pfVar42[lVar27 + -0xb] = auVar45._0_4_;
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar67)),auVar50,auVar49);
              auVar45 = vsubss_avx512f(auVar45,auVar47);
              pfVar22[lVar27 + -0xb] = auVar45._0_4_;
              iVar40 = iVar17 + -1 + iVar39;
              iVar37 = iVar17 + -1 + iVar13;
              fVar62 = pfVar34[iVar16 + -1 + iVar17];
              fVar67 = pfVar34[iVar14 + -1 + iVar17];
              iVar29 = (int)auVar46._0_4_;
              auVar46 = vfmadd213ss_avx512f(auVar87,auVar92._0_16_,auVar48);
              auVar49 = vsubss_avx512f(ZEXT416((uint)pfVar34[iVar37 + iVar14]),
                                       ZEXT416((uint)pfVar34[iVar15 + -1 + iVar17]));
              fVar71 = pfVar34[iVar15 + iVar37];
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar15 + iVar40] -
                                                      pfVar34[iVar40 + iVar14])),auVar50,auVar49);
              fVar77 = pfVar34[iVar16 + iVar37];
              pfVar42[lVar27 + -10] = (fVar67 - fVar71) + auVar45._0_4_;
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar77)),auVar50,auVar49);
              pfVar22[lVar27 + -10] = auVar45._0_4_ - (fVar67 - fVar71);
              iVar40 = iVar29 + -1 + iVar39;
              iVar37 = iVar29 + -1 + iVar13;
              fVar62 = pfVar34[iVar16 + -1 + iVar29];
              fVar67 = pfVar34[iVar14 + -1 + iVar29];
              fVar71 = pfVar34[iVar37 + iVar14];
              iVar17 = (int)auVar46._0_4_;
              auVar46 = vfmadd213ss_avx512f(auVar86,auVar92._0_16_,auVar48);
              fVar77 = pfVar34[iVar15 + -1 + iVar29];
              fVar3 = pfVar34[iVar15 + iVar37];
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar15 + iVar40] -
                                                      pfVar34[iVar40 + iVar14])),auVar50,
                                        ZEXT416((uint)(fVar71 - fVar77)));
              fVar68 = pfVar34[iVar16 + iVar37];
              pfVar42[lVar27 + -9] = (fVar67 - fVar3) + auVar45._0_4_;
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar68)),auVar50,
                                        ZEXT416((uint)(fVar71 - fVar77)));
              pfVar22[lVar27 + -9] = auVar45._0_4_ - (fVar67 - fVar3);
              iVar29 = iVar17 + -1 + iVar39;
              iVar37 = iVar17 + -1 + iVar13;
              fVar62 = pfVar34[iVar16 + -1 + iVar17];
              fVar67 = pfVar34[iVar14 + -1 + iVar17];
              in_ZMM14 = ZEXT464((uint)pfVar34[iVar37 + iVar14]);
              iVar40 = (int)auVar46._0_4_;
              auVar46 = vfmadd213ss_avx512f(auVar85,auVar92._0_16_,auVar48);
              fVar71 = pfVar34[iVar15 + iVar37];
              auVar49 = ZEXT416((uint)(pfVar34[iVar37 + iVar14] - pfVar34[iVar15 + -1 + iVar17]));
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar15 + iVar29] -
                                                      pfVar34[iVar29 + iVar14])),auVar50,auVar49);
              fVar77 = pfVar34[iVar16 + iVar37];
              pfVar42[lVar27 + -8] = (fVar67 - fVar71) + auVar45._0_4_;
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar77)),auVar50,auVar49);
              pfVar22[lVar27 + -8] = auVar45._0_4_ - (fVar67 - fVar71);
              iVar17 = iVar40 + -1 + iVar39;
              iVar37 = iVar40 + -1 + iVar13;
              fVar62 = pfVar34[iVar16 + -1 + iVar40];
              fVar67 = pfVar34[iVar14 + -1 + iVar40];
              fVar71 = pfVar34[iVar37 + iVar14];
              iVar29 = (int)auVar46._0_4_;
              auVar49 = ZEXT416((uint)fVar63);
              auVar46 = vfmadd213ss_avx512f(auVar83,auVar92._0_16_,auVar49);
              fVar77 = pfVar34[iVar15 + -1 + iVar40];
              fVar3 = pfVar34[iVar15 + iVar37];
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar15 + iVar17] -
                                                      pfVar34[iVar17 + iVar14])),auVar50,
                                        ZEXT416((uint)(fVar71 - fVar77)));
              fVar68 = pfVar34[iVar16 + iVar37];
              pfVar42[lVar27 + -7] = (fVar67 - fVar3) + auVar45._0_4_;
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar68)),auVar50,
                                        ZEXT416((uint)(fVar71 - fVar77)));
              pfVar22[lVar27 + -7] = auVar45._0_4_ - (fVar67 - fVar3);
              iVar40 = iVar29 + -1 + iVar39;
              iVar37 = iVar29 + -1 + iVar13;
              fVar62 = pfVar34[iVar16 + -1 + iVar29];
              fVar67 = pfVar34[iVar14 + -1 + iVar29];
              fVar71 = pfVar34[iVar37 + iVar14];
              iVar17 = (int)auVar46._0_4_;
              auVar46 = vfmadd213ss_avx512f(auVar82,auVar92._0_16_,auVar49);
              fVar77 = pfVar34[iVar15 + -1 + iVar29];
              fVar3 = pfVar34[iVar15 + iVar37];
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar15 + iVar40] -
                                                      pfVar34[iVar40 + iVar14])),auVar50,
                                        ZEXT416((uint)(fVar71 - fVar77)));
              fVar68 = pfVar34[iVar16 + iVar37];
              pfVar42[lVar27 + -6] = (fVar67 - fVar3) + auVar45._0_4_;
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar68)),auVar50,
                                        ZEXT416((uint)(fVar71 - fVar77)));
              pfVar22[lVar27 + -6] = auVar45._0_4_ - (fVar67 - fVar3);
              iVar29 = iVar17 + -1 + iVar39;
              iVar37 = iVar17 + -1 + iVar13;
              fVar62 = pfVar34[iVar16 + -1 + iVar17];
              fVar67 = pfVar34[iVar14 + -1 + iVar17];
              fVar71 = pfVar34[iVar37 + iVar14];
              iVar40 = (int)auVar46._0_4_;
              auVar46 = vfmadd213ss_avx512f(auVar80,auVar92._0_16_,auVar49);
              fVar77 = pfVar34[iVar15 + -1 + iVar17];
              fVar3 = pfVar34[iVar15 + iVar37];
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar15 + iVar29] -
                                                      pfVar34[iVar29 + iVar14])),auVar50,
                                        ZEXT416((uint)(fVar71 - fVar77)));
              fVar68 = pfVar34[iVar16 + iVar37];
              pfVar42[lVar27 + -5] = (fVar67 - fVar3) + auVar45._0_4_;
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar68)),auVar50,
                                        ZEXT416((uint)(fVar71 - fVar77)));
              pfVar22[lVar27 + -5] = auVar45._0_4_ - (fVar67 - fVar3);
              iVar17 = iVar40 + -1 + iVar39;
              iVar37 = iVar40 + -1 + iVar13;
              fVar62 = pfVar34[iVar16 + -1 + iVar40];
              fVar67 = pfVar34[iVar14 + -1 + iVar40];
              in_ZMM10 = ZEXT464((uint)pfVar34[iVar37 + iVar14]);
              iVar29 = (int)auVar46._0_4_;
              auVar46 = vfmadd213ss_avx512f(auVar79,auVar92._0_16_,auVar49);
              fVar71 = pfVar34[iVar15 + iVar37];
              auVar47 = ZEXT416((uint)(pfVar34[iVar37 + iVar14] - pfVar34[iVar15 + -1 + iVar40]));
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar15 + iVar17] -
                                                      pfVar34[iVar17 + iVar14])),auVar50,auVar47);
              fVar77 = pfVar34[iVar16 + iVar37];
              pfVar42[lVar27 + -4] = (fVar67 - fVar71) + auVar45._0_4_;
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar77)),auVar50,auVar47);
              pfVar22[lVar27 + -4] = auVar45._0_4_ - (fVar67 - fVar71);
              iVar40 = iVar29 + -1 + iVar39;
              iVar37 = iVar29 + -1 + iVar13;
              fVar62 = pfVar34[iVar16 + -1 + iVar29];
              fVar67 = pfVar34[iVar14 + -1 + iVar29];
              in_ZMM9 = ZEXT464((uint)pfVar34[iVar37 + iVar14]);
              iVar17 = (int)auVar46._0_4_;
              auVar46 = vfmadd213ss_avx512f(auVar76,auVar92._0_16_,auVar49);
              fVar71 = pfVar34[iVar15 + iVar37];
              auVar47 = ZEXT416((uint)(pfVar34[iVar37 + iVar14] - pfVar34[iVar15 + -1 + iVar29]));
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar15 + iVar40] -
                                                      pfVar34[iVar40 + iVar14])),auVar50,auVar47);
              fVar77 = pfVar34[iVar16 + iVar37];
              pfVar42[lVar27 + -3] = (fVar67 - fVar71) + auVar45._0_4_;
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar77)),auVar50,auVar47);
              pfVar22[lVar27 + -3] = auVar45._0_4_ - (fVar67 - fVar71);
              iVar40 = iVar17 + -1 + iVar39;
              iVar37 = iVar17 + -1 + iVar13;
              fVar62 = pfVar34[iVar16 + -1 + iVar17];
              fVar67 = pfVar34[iVar14 + -1 + iVar17];
              fVar71 = pfVar34[iVar37 + iVar14];
              iVar29 = (int)auVar46._0_4_;
              auVar46 = vfmadd213ss_avx512f(auVar74,auVar92._0_16_,auVar49);
              fVar77 = pfVar34[iVar15 + -1 + iVar17];
              fVar3 = pfVar34[iVar15 + iVar37];
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar15 + iVar40] -
                                                      pfVar34[iVar40 + iVar14])),auVar50,
                                        ZEXT416((uint)(fVar71 - fVar77)));
              fVar68 = pfVar34[iVar16 + iVar37];
              pfVar42[lVar27 + -2] = (fVar67 - fVar3) + auVar45._0_4_;
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar68)),auVar50,
                                        ZEXT416((uint)(fVar71 - fVar77)));
              pfVar22[lVar27 + -2] = auVar45._0_4_ - (fVar67 - fVar3);
              iVar40 = iVar29 + -1 + iVar39;
              iVar37 = iVar29 + -1 + iVar13;
              fVar62 = pfVar34[iVar16 + -1 + iVar29];
              fVar67 = pfVar34[iVar14 + -1 + iVar29];
              fVar71 = pfVar34[iVar37 + iVar14];
              iVar17 = (int)auVar46._0_4_;
              fVar77 = pfVar34[iVar15 + -1 + iVar29];
              fVar3 = pfVar34[iVar15 + iVar37];
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar15 + iVar40] -
                                                      pfVar34[iVar40 + iVar14])),auVar50,
                                        ZEXT416((uint)(fVar71 - fVar77)));
              fVar68 = pfVar34[iVar16 + iVar37];
              pfVar42[lVar27 + -1] = (fVar67 - fVar3) + auVar45._0_4_;
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar68)),auVar50,
                                        ZEXT416((uint)(fVar71 - fVar77)));
              iVar40 = iVar17 + -1 + iVar39;
              iVar37 = iVar17 + -1 + iVar13;
              pfVar22[lVar27 + -1] = auVar45._0_4_ - (fVar67 - fVar3);
              fVar62 = pfVar34[iVar16 + -1 + iVar17];
              fVar67 = pfVar34[iVar14 + -1 + iVar17];
              fVar71 = pfVar34[iVar37 + iVar14];
              fVar77 = pfVar34[iVar15 + -1 + iVar17];
              fVar3 = pfVar34[iVar15 + iVar37];
              fVar68 = pfVar34[iVar16 + iVar37];
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar15 + iVar40] -
                                                      pfVar34[iVar40 + iVar14])),auVar50,
                                        ZEXT416((uint)(fVar71 - fVar77)));
              pfVar42[lVar27] = (fVar67 - fVar3) + auVar45._0_4_;
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar68)),auVar50,
                                        ZEXT416((uint)(fVar71 - fVar77)));
              pfVar22[lVar27] = auVar45._0_4_ - (fVar67 - fVar3);
              lVar27 = lVar27 + 0xc;
            } while (iVar23 + -0xc < 0);
            iVar30 = iVar30 + 1;
            lVar19 = lVar19 + 1;
            pfVar22 = pfVar22 + 0x18;
            pfVar42 = pfVar42 + 0x18;
          } while (lVar19 != 0x18);
          goto LAB_001ae59d;
        }
      }
    }
  }
  iVar1 = iVar39 * 2;
  auVar58 = vbroadcastss_avx512vl(auVar92._0_16_);
  iVar13 = -0xc;
  lVar27 = 0;
  lVar19 = 0;
  auVar93 = auVar92;
  do {
    auVar64._0_4_ = (float)iVar13;
    auVar64._4_12_ = in_ZMM8._4_12_;
    auVar45 = vfmadd213ss_avx512f(auVar64,auVar93._0_16_,ZEXT416((uint)fVar2));
    fVar62 = auVar45._0_4_;
    iVar37 = (int)((double)((ulong)(0.0 <= fVar62) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar62) * -0x4020000000000000) + (double)fVar62);
    iVar14 = iVar1 + iVar37;
    iVar15 = iVar37 + -1;
    iVar16 = iVar37 + -1 + iVar39;
    lVar26 = lVar27;
    iVar30 = -0xc;
    do {
      auVar65._0_4_ = (float)iVar30;
      auVar84 = in_ZMM8._4_12_;
      auVar65._4_12_ = auVar84;
      auVar48 = auVar93._0_16_;
      auVar45 = vfmadd213ss_avx512f(auVar65,auVar48,auVar49);
      auVar78._0_4_ = (float)(iVar30 + 1);
      auVar78._4_12_ = auVar84;
      auVar46 = vfmadd213ss_avx512f(auVar78,auVar48,auVar49);
      auVar72._0_4_ = (float)(iVar30 + 2);
      auVar72._4_12_ = auVar84;
      auVar47 = vfmadd213ss_avx512f(auVar72,auVar48,auVar49);
      auVar69._0_4_ = (float)(iVar30 + 3);
      auVar69._4_12_ = auVar84;
      auVar48 = vfmadd213ss_avx512f(auVar69,auVar48,auVar49);
      fVar62 = auVar45._0_4_;
      fVar77 = auVar46._0_4_;
      fVar71 = auVar47._0_4_;
      fVar67 = auVar48._0_4_;
      pfVar34 = (float *)((long)haarResponseY + lVar26);
      iVar23 = (int)((double)((ulong)(0.0 <= fVar62) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar62) * -0x4020000000000000) + (double)fVar62);
      if ((((iVar37 < 1) || (iVar23 < 1)) || (iimage->height < iVar14)) ||
         (iVar17 = iVar1 + iVar23, iimage->width < iVar17)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar37,iVar23,iVar39,(float *)((long)haarResponseX + lVar26),pfVar34);
      }
      else {
        iVar29 = iVar23 + -1 + iVar39;
        pfVar42 = iimage->data;
        iVar40 = iimage->data_width;
        iVar36 = iVar40 * iVar15;
        fVar62 = pfVar42[iVar40 * iVar16 + -1 + iVar23];
        iVar31 = iVar40 * (iVar1 + -1 + iVar37);
        fVar3 = pfVar42[iVar31 + -1 + iVar23];
        fVar68 = pfVar42[iVar31 + -1 + iVar17];
        fVar4 = pfVar42[iVar36 + -1 + iVar23];
        fVar5 = pfVar42[iVar36 + -1 + iVar17];
        fVar6 = pfVar42[iVar40 * iVar16 + -1 + iVar17];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar36 + iVar29] - pfVar42[iVar31 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar68 - fVar4)));
        *(float *)((long)haarResponseX + lVar26) = (fVar3 - fVar5) + auVar45._0_4_;
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar6)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar68 - fVar4)));
        *pfVar34 = auVar45._0_4_ - (fVar3 - fVar5);
      }
      iVar23 = (int)((double)((ulong)(0.0 <= fVar77) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar77) * -0x4020000000000000) + (double)fVar77);
      pfVar34 = (float *)((long)haarResponseX + lVar26 + 4);
      pfVar42 = (float *)((long)haarResponseY + lVar26 + 4);
      if (((iVar37 < 1) || (iVar23 < 1)) ||
         ((iimage->height < iVar14 || (iVar17 = iVar1 + iVar23, iimage->width < iVar17)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar37,iVar23,iVar39,pfVar34,pfVar42);
      }
      else {
        iVar36 = iVar23 + -1 + iVar39;
        pfVar22 = iimage->data;
        iVar40 = iimage->data_width;
        iVar31 = iVar40 * iVar15;
        fVar62 = pfVar22[iVar40 * iVar16 + -1 + iVar23];
        iVar29 = iVar40 * (iVar1 + -1 + iVar37);
        fVar77 = pfVar22[iVar29 + -1 + iVar23];
        fVar3 = pfVar22[iVar29 + -1 + iVar17];
        fVar68 = pfVar22[iVar31 + -1 + iVar23];
        fVar4 = pfVar22[iVar31 + -1 + iVar17];
        fVar5 = pfVar22[iVar40 * iVar16 + -1 + iVar17];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar22[iVar31 + iVar36] - pfVar22[iVar29 + iVar36]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar3 - fVar68)));
        *pfVar34 = (fVar77 - fVar4) + auVar45._0_4_;
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar3 - fVar68)));
        *pfVar42 = auVar45._0_4_ - (fVar77 - fVar4);
      }
      iVar23 = (int)((double)((ulong)(0.0 <= fVar71) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar71) * -0x4020000000000000) + (double)fVar71);
      pfVar34 = (float *)((long)haarResponseX + lVar26 + 8);
      pfVar42 = (float *)((long)haarResponseY + lVar26 + 8);
      if (((iVar37 < 1) || (iVar23 < 1)) ||
         ((iimage->height < iVar14 || (iVar17 = iVar1 + iVar23, iimage->width < iVar17)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar37,iVar23,iVar39,pfVar34,pfVar42);
      }
      else {
        iVar29 = iVar23 + -1 + iVar39;
        pfVar22 = iimage->data;
        iVar40 = iimage->data_width;
        iVar36 = iVar40 * iVar15;
        fVar62 = pfVar22[iVar40 * iVar16 + -1 + iVar23];
        iVar31 = iVar40 * (iVar1 + -1 + iVar37);
        fVar71 = pfVar22[iVar31 + -1 + iVar23];
        fVar77 = pfVar22[iVar31 + -1 + iVar17];
        fVar3 = pfVar22[iVar36 + -1 + iVar23];
        fVar68 = pfVar22[iVar36 + -1 + iVar17];
        fVar4 = pfVar22[iVar40 * iVar16 + -1 + iVar17];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar22[iVar36 + iVar29] - pfVar22[iVar31 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar77 - fVar3)));
        *pfVar34 = (fVar71 - fVar68) + auVar45._0_4_;
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar77 - fVar3)));
        *pfVar42 = auVar45._0_4_ - (fVar71 - fVar68);
      }
      iVar23 = (int)((double)((ulong)(0.0 <= fVar67) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar67) * -0x4020000000000000) + (double)fVar67);
      pfVar34 = (float *)((long)haarResponseX + lVar26 + 0xc);
      pfVar42 = (float *)((long)haarResponseY + lVar26 + 0xc);
      if ((((iVar37 < 1) || (iVar23 < 1)) || (iimage->height < iVar14)) ||
         (iVar17 = iVar1 + iVar23, iimage->width < iVar17)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar37,iVar23,iVar39,pfVar34,pfVar42);
      }
      else {
        iVar29 = iVar23 + -1 + iVar39;
        pfVar22 = iimage->data;
        iVar40 = iimage->data_width;
        iVar36 = iVar40 * iVar15;
        fVar62 = pfVar22[iVar40 * iVar16 + -1 + iVar23];
        iVar31 = iVar40 * (iVar1 + -1 + iVar37);
        fVar67 = pfVar22[iVar31 + -1 + iVar23];
        fVar71 = pfVar22[iVar31 + -1 + iVar17];
        fVar77 = pfVar22[iVar36 + -1 + iVar23];
        fVar3 = pfVar22[iVar36 + -1 + iVar17];
        fVar68 = pfVar22[iVar40 * iVar16 + -1 + iVar17];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar22[iVar36 + iVar29] - pfVar22[iVar31 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar71 - fVar77)));
        *pfVar34 = (fVar67 - fVar3) + auVar45._0_4_;
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar68)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar71 - fVar77)));
        *pfVar42 = auVar45._0_4_ - (fVar67 - fVar3);
      }
      auVar59 = vpbroadcastd_avx512vl();
      auVar59 = vpaddd_avx2(auVar59,_DAT_00576740);
      auVar59 = vcvtdq2ps_avx(auVar59);
      auVar12._4_4_ = fVar63;
      auVar12._0_4_ = fVar63;
      auVar12._8_4_ = fVar63;
      auVar12._12_4_ = fVar63;
      auVar12._16_4_ = fVar63;
      auVar12._20_4_ = fVar63;
      auVar12._24_4_ = fVar63;
      auVar12._28_4_ = fVar63;
      auVar46 = vfmadd132ps_fma(auVar59,auVar12,auVar58);
      auVar45 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xff);
      uVar20 = vcmpps_avx512vl(ZEXT1632(auVar46),_DAT_00576760,0xd);
      bVar43 = (bool)((byte)(uVar20 >> 7) & 1);
      iVar23 = (int)((double)((ulong)bVar43 * 0x3fe0000000000000 +
                             (ulong)!bVar43 * -0x4020000000000000) + (double)auVar45._0_4_);
      pfVar34 = (float *)((long)haarResponseX + lVar26 + 0x10);
      pfVar42 = (float *)((long)haarResponseY + lVar26 + 0x10);
      if (((iVar37 < 1) || (iVar23 < 1)) ||
         ((iimage->height < iVar14 || (iVar17 = iVar1 + iVar23, iimage->width < iVar17)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar37,iVar23,iVar39,pfVar34,pfVar42);
      }
      else {
        iVar29 = iVar23 + -1 + iVar39;
        pfVar22 = iimage->data;
        iVar40 = iimage->data_width;
        iVar36 = iVar40 * iVar15;
        fVar62 = pfVar22[iVar40 * iVar16 + -1 + iVar23];
        iVar31 = iVar40 * (iVar1 + -1 + iVar37);
        fVar67 = pfVar22[iVar31 + -1 + iVar23];
        fVar71 = pfVar22[iVar31 + -1 + iVar17];
        fVar77 = pfVar22[iVar36 + -1 + iVar23];
        fVar3 = pfVar22[iVar36 + -1 + iVar17];
        fVar68 = pfVar22[iVar40 * iVar16 + -1 + iVar17];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar22[iVar36 + iVar29] - pfVar22[iVar31 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar71 - fVar77)));
        *pfVar34 = (fVar67 - fVar3) + auVar45._0_4_;
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar68)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar71 - fVar77)));
        *pfVar42 = auVar45._0_4_ - (fVar67 - fVar3);
      }
      bVar44 = (byte)uVar20;
      auVar45 = vpermilpd_avx((undefined1  [16])0x0,1);
      iVar23 = (int)((double)((ulong)(bVar44 >> 6 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar44 >> 6 & 1) * -0x4020000000000000) +
                    (double)auVar45._0_4_);
      pfVar34 = (float *)((long)haarResponseX + lVar26 + 0x14);
      pfVar42 = (float *)((long)haarResponseY + lVar26 + 0x14);
      if (((iVar37 < 1) || (iVar23 < 1)) ||
         ((iimage->height < iVar14 || (iVar17 = iVar1 + iVar23, iimage->width < iVar17)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar37,iVar23,iVar39,pfVar34,pfVar42);
      }
      else {
        iVar29 = iVar23 + -1 + iVar39;
        pfVar22 = iimage->data;
        iVar40 = iimage->data_width;
        iVar36 = iVar40 * iVar15;
        fVar62 = pfVar22[iVar40 * iVar16 + -1 + iVar23];
        iVar31 = iVar40 * (iVar1 + -1 + iVar37);
        fVar67 = pfVar22[iVar31 + -1 + iVar23];
        fVar71 = pfVar22[iVar31 + -1 + iVar17];
        fVar77 = pfVar22[iVar36 + -1 + iVar23];
        fVar3 = pfVar22[iVar36 + -1 + iVar17];
        fVar68 = pfVar22[iVar40 * iVar16 + -1 + iVar17];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar22[iVar36 + iVar29] - pfVar22[iVar31 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar71 - fVar77)));
        *pfVar34 = (fVar67 - fVar3) + auVar45._0_4_;
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar68)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar71 - fVar77)));
        *pfVar42 = auVar45._0_4_ - (fVar67 - fVar3);
      }
      auVar45 = vmovshdup_avx((undefined1  [16])0x0);
      iVar23 = (int)((double)((ulong)(bVar44 >> 5 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar44 >> 5 & 1) * -0x4020000000000000) +
                    (double)auVar45._0_4_);
      pfVar34 = (float *)((long)haarResponseX + lVar26 + 0x18);
      pfVar42 = (float *)((long)haarResponseY + lVar26 + 0x18);
      if ((((iVar37 < 1) || (iVar23 < 1)) || (iimage->height < iVar14)) ||
         (iVar17 = iVar1 + iVar23, iimage->width < iVar17)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar37,iVar23,iVar39,pfVar34,pfVar42);
      }
      else {
        iVar29 = iVar23 + -1 + iVar39;
        pfVar22 = iimage->data;
        iVar40 = iimage->data_width;
        iVar36 = iVar40 * iVar15;
        fVar62 = pfVar22[iVar40 * iVar16 + -1 + iVar23];
        iVar31 = iVar40 * (iVar1 + -1 + iVar37);
        fVar67 = pfVar22[iVar31 + -1 + iVar23];
        fVar71 = pfVar22[iVar31 + -1 + iVar17];
        fVar77 = pfVar22[iVar36 + -1 + iVar23];
        fVar3 = pfVar22[iVar36 + -1 + iVar17];
        fVar68 = pfVar22[iVar40 * iVar16 + -1 + iVar17];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar22[iVar36 + iVar29] - pfVar22[iVar31 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar71 - fVar77)));
        *pfVar34 = (fVar67 - fVar3) + auVar45._0_4_;
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar68)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar71 - fVar77)));
        *pfVar42 = auVar45._0_4_ - (fVar67 - fVar3);
      }
      iVar23 = (int)((double)((ulong)(bVar44 >> 4 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar44 >> 4 & 1) * -0x4020000000000000) + 0.0);
      pfVar34 = (float *)((long)haarResponseX + lVar26 + 0x1c);
      pfVar42 = (float *)((long)haarResponseY + lVar26 + 0x1c);
      if (((iVar37 < 1) || (iVar23 < 1)) ||
         ((iimage->height < iVar14 || (iVar17 = iVar1 + iVar23, iimage->width < iVar17)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar37,iVar23,iVar39,pfVar34,pfVar42);
      }
      else {
        iVar29 = iVar23 + -1 + iVar39;
        pfVar22 = iimage->data;
        iVar40 = iimage->data_width;
        iVar36 = iVar40 * iVar15;
        fVar62 = pfVar22[iVar40 * iVar16 + -1 + iVar23];
        iVar31 = iVar40 * (iVar1 + -1 + iVar37);
        fVar67 = pfVar22[iVar31 + -1 + iVar23];
        fVar71 = pfVar22[iVar31 + -1 + iVar17];
        fVar77 = pfVar22[iVar36 + -1 + iVar23];
        fVar3 = pfVar22[iVar36 + -1 + iVar17];
        fVar68 = pfVar22[iVar40 * iVar16 + -1 + iVar17];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar22[iVar36 + iVar29] - pfVar22[iVar31 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar71 - fVar77)));
        *pfVar34 = (fVar67 - fVar3) + auVar45._0_4_;
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar68)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar71 - fVar77)));
        *pfVar42 = auVar45._0_4_ - (fVar67 - fVar3);
      }
      auVar45 = vpermilps_avx(auVar46,0xff);
      iVar23 = (int)((double)((ulong)(bVar44 >> 3 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar44 >> 3 & 1) * -0x4020000000000000) +
                    (double)auVar45._0_4_);
      pfVar34 = (float *)((long)haarResponseX + lVar26 + 0x20);
      pfVar42 = (float *)((long)haarResponseY + lVar26 + 0x20);
      if (((iVar37 < 1) || (iVar23 < 1)) ||
         ((iimage->height < iVar14 || (iVar17 = iVar1 + iVar23, iimage->width < iVar17)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar37,iVar23,iVar39,pfVar34,pfVar42);
      }
      else {
        iVar29 = iVar23 + -1 + iVar39;
        pfVar22 = iimage->data;
        iVar40 = iimage->data_width;
        iVar36 = iVar40 * iVar15;
        fVar62 = pfVar22[iVar40 * iVar16 + -1 + iVar23];
        iVar31 = iVar40 * (iVar1 + -1 + iVar37);
        fVar67 = pfVar22[iVar31 + -1 + iVar23];
        fVar71 = pfVar22[iVar31 + -1 + iVar17];
        fVar77 = pfVar22[iVar36 + -1 + iVar23];
        fVar3 = pfVar22[iVar36 + -1 + iVar17];
        fVar68 = pfVar22[iVar40 * iVar16 + -1 + iVar17];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar22[iVar36 + iVar29] - pfVar22[iVar31 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar71 - fVar77)));
        *pfVar34 = (fVar67 - fVar3) + auVar45._0_4_;
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar68)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar71 - fVar77)));
        *pfVar42 = auVar45._0_4_ - (fVar67 - fVar3);
      }
      auVar45 = vpermilpd_avx(auVar46,1);
      iVar23 = (int)((double)((ulong)(bVar44 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar44 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar45._0_4_);
      pfVar34 = (float *)((long)haarResponseX + lVar26 + 0x24);
      pfVar42 = (float *)((long)haarResponseY + lVar26 + 0x24);
      if ((((iVar37 < 1) || (iVar23 < 1)) || (iimage->height < iVar14)) ||
         (iVar17 = iVar1 + iVar23, iimage->width < iVar17)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar37,iVar23,iVar39,pfVar34,pfVar42);
      }
      else {
        iVar29 = iVar23 + -1 + iVar39;
        pfVar22 = iimage->data;
        iVar40 = iimage->data_width;
        iVar36 = iVar40 * iVar15;
        fVar62 = pfVar22[iVar40 * iVar16 + -1 + iVar23];
        iVar31 = iVar40 * (iVar1 + -1 + iVar37);
        fVar67 = pfVar22[iVar31 + -1 + iVar23];
        fVar71 = pfVar22[iVar31 + -1 + iVar17];
        fVar77 = pfVar22[iVar36 + -1 + iVar23];
        fVar3 = pfVar22[iVar36 + -1 + iVar17];
        fVar68 = pfVar22[iVar40 * iVar16 + -1 + iVar17];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar22[iVar36 + iVar29] - pfVar22[iVar31 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar71 - fVar77)));
        *pfVar34 = (fVar67 - fVar3) + auVar45._0_4_;
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar68)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar71 - fVar77)));
        *pfVar42 = auVar45._0_4_ - (fVar67 - fVar3);
      }
      auVar45 = vmovshdup_avx(auVar46);
      iVar23 = (int)((double)((ulong)(bVar44 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar44 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar45._0_4_);
      pfVar34 = (float *)((long)haarResponseX + lVar26 + 0x28);
      pfVar42 = (float *)((long)haarResponseY + lVar26 + 0x28);
      if (((iVar37 < 1) || (iVar23 < 1)) ||
         ((iimage->height < iVar14 || (iVar17 = iVar1 + iVar23, iimage->width < iVar17)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar37,iVar23,iVar39,pfVar34,pfVar42);
      }
      else {
        iVar29 = iVar23 + -1 + iVar39;
        pfVar22 = iimage->data;
        iVar40 = iimage->data_width;
        iVar36 = iVar40 * iVar15;
        fVar62 = pfVar22[iVar40 * iVar16 + -1 + iVar23];
        iVar31 = iVar40 * (iVar1 + -1 + iVar37);
        fVar67 = pfVar22[iVar31 + -1 + iVar23];
        fVar71 = pfVar22[iVar31 + -1 + iVar17];
        fVar77 = pfVar22[iVar36 + -1 + iVar23];
        fVar3 = pfVar22[iVar36 + -1 + iVar17];
        fVar68 = pfVar22[iVar40 * iVar16 + -1 + iVar17];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar22[iVar36 + iVar29] - pfVar22[iVar31 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar71 - fVar77)));
        *pfVar34 = (fVar67 - fVar3) + auVar45._0_4_;
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar68)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar71 - fVar77)));
        *pfVar42 = auVar45._0_4_ - (fVar67 - fVar3);
      }
      local_c8 = auVar46._0_4_;
      iVar23 = (int)((double)((ulong)(bVar44 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar44 & 1) * -0x4020000000000000) + (double)local_c8);
      pfVar34 = (float *)((long)haarResponseX + lVar26 + 0x2c);
      pfVar42 = (float *)((long)haarResponseY + lVar26 + 0x2c);
      if (((iVar37 < 1) || (iVar23 < 1)) ||
         ((iimage->height < iVar14 || (iVar17 = iVar1 + iVar23, iimage->width < iVar17)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar37,iVar23,iVar39,pfVar34,pfVar42);
      }
      else {
        iVar29 = iVar23 + -1 + iVar39;
        pfVar22 = iimage->data;
        iVar40 = iimage->data_width;
        iVar36 = iVar40 * iVar15;
        fVar62 = pfVar22[iVar40 * iVar16 + -1 + iVar23];
        iVar31 = iVar40 * (iVar1 + -1 + iVar37);
        fVar67 = pfVar22[iVar31 + -1 + iVar23];
        fVar71 = pfVar22[iVar31 + -1 + iVar17];
        fVar77 = pfVar22[iVar36 + -1 + iVar23];
        fVar3 = pfVar22[iVar36 + -1 + iVar17];
        fVar68 = pfVar22[iVar40 * iVar16 + -1 + iVar17];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar22[iVar36 + iVar29] - pfVar22[iVar31 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar71 - fVar77)));
        *pfVar34 = (fVar67 - fVar3) + auVar45._0_4_;
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar68)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar71 - fVar77)));
        *pfVar42 = auVar45._0_4_ - (fVar67 - fVar3);
      }
      auVar93 = ZEXT1664(auVar92._0_16_);
      lVar26 = lVar26 + 0x30;
      bVar43 = iVar30 < 0;
      iVar30 = iVar30 + 0xc;
    } while (bVar43);
    iVar13 = iVar13 + 1;
    lVar19 = lVar19 + 1;
    lVar27 = lVar27 + 0x60;
  } while (lVar19 != 0x18);
LAB_001ae59d:
  auVar45 = vmulss_avx512f(auVar92._0_16_,ZEXT416(0x3f000000));
  auVar90._8_4_ = 0x3effffff;
  auVar90._0_8_ = 0x3effffff3effffff;
  auVar90._12_4_ = 0x3effffff;
  auVar88._8_4_ = 0x80000000;
  auVar88._0_8_ = 0x8000000080000000;
  auVar88._12_4_ = 0x80000000;
  auVar46 = vpternlogd_avx512vl(auVar90,auVar45,auVar88,0xf8);
  auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar46._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vmulss_avx512f(auVar92._0_16_,ZEXT416(0x3fc00000));
  auVar49 = vpternlogd_avx512vl(auVar90,auVar46,auVar88,0xf8);
  auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar49._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar49 = vmulss_avx512f(auVar92._0_16_,ZEXT416(0x40200000));
  auVar47 = vpternlogd_avx512vl(auVar90,auVar49,auVar88,0xf8);
  auVar49 = ZEXT416((uint)(auVar49._0_4_ + auVar47._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar47 = vmulss_avx512f(auVar92._0_16_,ZEXT416(0x40600000));
  auVar48 = vpternlogd_avx512vl(auVar90,auVar47,auVar88,0xf8);
  auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar48._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vmulss_avx512f(auVar92._0_16_,ZEXT416(0x40900000));
  auVar50 = vpternlogd_avx512vl(auVar90,auVar48,auVar88,0xf8);
  auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar50._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar50 = vmulss_avx512f(auVar92._0_16_,ZEXT416(0x40b00000));
  auVar51 = vpternlogd_avx512vl(auVar90,auVar50,auVar88,0xf8);
  auVar50 = ZEXT416((uint)(auVar50._0_4_ + auVar51._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vmulss_avx512f(auVar92._0_16_,ZEXT416(0x40d00000));
  auVar52 = vpternlogd_avx512vl(auVar90,auVar51,auVar88,0xf8);
  auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar52._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vmulss_avx512f(auVar92._0_16_,ZEXT416(0x40f00000));
  auVar53 = vpternlogd_avx512vl(auVar90,auVar52,auVar88,0xf8);
  auVar52 = ZEXT416((uint)(auVar53._0_4_ + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vmulss_avx512f(auVar92._0_16_,ZEXT416(0x41080000));
  auVar54 = vpternlogd_avx512vl(auVar90,auVar53,auVar88,0xf8);
  auVar53 = ZEXT416((uint)(auVar53._0_4_ + auVar54._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vmulss_avx512f(auVar92._0_16_,ZEXT416(0x41180000));
  auVar55 = vpternlogd_avx512vl(auVar90,auVar54,auVar88,0xf8);
  auVar54 = ZEXT416((uint)(auVar54._0_4_ + auVar55._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vmulss_avx512f(auVar92._0_16_,ZEXT416(0x41280000));
  auVar56 = vpternlogd_avx512vl(auVar90,auVar55,auVar88,0xf8);
  auVar55 = ZEXT416((uint)(auVar55._0_4_ + auVar56._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vmulss_avx512f(auVar92._0_16_,ZEXT416(0x41380000));
  auVar57 = vpternlogd_avx512vl(auVar90,auVar56,auVar88,0xf8);
  auVar56 = ZEXT416((uint)(auVar56._0_4_ + auVar57._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  fVar68 = auVar49._0_4_;
  fVar63 = fVar68 + auVar46._0_4_;
  fVar2 = fVar68 + auVar45._0_4_;
  fVar62 = fVar68 - auVar45._0_4_;
  fVar67 = fVar68 - auVar46._0_4_;
  fVar71 = fVar68 - auVar47._0_4_;
  fVar77 = fVar68 - auVar48._0_4_;
  fVar3 = fVar68 - auVar50._0_4_;
  fVar68 = fVar68 - auVar51._0_4_;
  fVar81 = auVar52._0_4_;
  fVar4 = fVar81 - auVar47._0_4_;
  fVar5 = fVar81 - auVar48._0_4_;
  fVar6 = fVar81 - auVar50._0_4_;
  fVar7 = fVar81 - auVar51._0_4_;
  fVar8 = fVar81 - auVar53._0_4_;
  fVar9 = fVar81 - auVar54._0_4_;
  fVar10 = fVar81 - auVar55._0_4_;
  fVar81 = fVar81 - auVar56._0_4_;
  gauss_s1_c0[0] = expf(fVar63 * fVar63 * fVar61);
  gauss_s1_c0[1] = expf(fVar2 * fVar2 * fVar61);
  gauss_s1_c0[2] = expf(fVar62 * fVar62 * fVar61);
  gauss_s1_c0[3] = expf(fVar67 * fVar67 * fVar61);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar71 * fVar71 * fVar61);
  gauss_s1_c0[6] = expf(fVar77 * fVar77 * fVar61);
  gauss_s1_c0[7] = expf(fVar3 * fVar3 * fVar61);
  gauss_s1_c0[8] = expf(fVar68 * fVar68 * fVar61);
  gauss_s1_c1[0] = expf(fVar4 * fVar4 * fVar61);
  gauss_s1_c1[1] = expf(fVar5 * fVar5 * fVar61);
  gauss_s1_c1[2] = expf(fVar6 * fVar6 * fVar61);
  gauss_s1_c1[3] = expf(fVar7 * fVar7 * fVar61);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar8 * fVar8 * fVar61);
  gauss_s1_c1[6] = expf(fVar9 * fVar9 * fVar61);
  gauss_s1_c1[7] = expf(fVar10 * fVar10 * fVar61);
  gauss_s1_c1[8] = expf(fVar81 * fVar81 * fVar61);
  uVar20 = 0xfffffff8;
  lVar19 = 0;
  fVar63 = 0.0;
  auVar66._8_4_ = 0x7fffffff;
  auVar66._0_8_ = 0x7fffffff7fffffff;
  auVar66._12_4_ = 0x7fffffff;
  lVar27 = 0;
  lVar26 = 0;
  do {
    pfVar34 = gauss_s1_c1;
    uVar18 = (uint)uVar20;
    if (uVar18 != 7) {
      pfVar34 = gauss_s1_c0;
    }
    if (uVar18 == 0xfffffff8) {
      pfVar34 = gauss_s1_c1;
    }
    lVar27 = (long)(int)lVar27;
    iVar39 = (int)lVar26;
    lVar26 = (long)iVar39;
    lVar33 = (long)haarResponseX + lVar19;
    lVar25 = (long)haarResponseY + lVar19;
    uVar32 = 0xfffffff8;
    uVar28 = 0;
    do {
      pfVar42 = gauss_s1_c1;
      if (uVar32 != 7) {
        pfVar42 = gauss_s1_c0;
      }
      if (uVar32 == 0xfffffff8) {
        pfVar42 = gauss_s1_c1;
      }
      uVar21 = (ulong)(uVar32 >> 0x1c & 0xfffffff8);
      auVar93 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar24 = uVar28;
      lVar38 = lVar33;
      lVar41 = lVar25;
      do {
        lVar35 = 0;
        pfVar22 = (float *)((long)pfVar34 + (ulong)(uint)((int)(uVar20 >> 0x1f) << 5));
        do {
          fVar2 = pfVar42[uVar21] * *pfVar22;
          auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar41 + lVar35 * 4)),
                                  ZEXT416(*(uint *)(lVar38 + lVar35 * 4)),0x10);
          auVar75._0_4_ = fVar2 * auVar45._0_4_;
          auVar75._4_4_ = fVar2 * auVar45._4_4_;
          auVar75._8_4_ = fVar2 * auVar45._8_4_;
          auVar75._12_4_ = fVar2 * auVar45._12_4_;
          auVar45 = vandps_avx(auVar75,auVar66);
          auVar45 = vmovlhps_avx(auVar75,auVar45);
          auVar70._0_4_ = auVar93._0_4_ + auVar45._0_4_;
          auVar70._4_4_ = auVar93._4_4_ + auVar45._4_4_;
          auVar70._8_4_ = auVar93._8_4_ + auVar45._8_4_;
          auVar70._12_4_ = auVar93._12_4_ + auVar45._12_4_;
          auVar93 = ZEXT1664(auVar70);
          pfVar22 = pfVar22 + (ulong)(~uVar18 >> 0x1f) * 2 + -1;
          lVar35 = lVar35 + 1;
        } while (lVar35 != 9);
        uVar24 = uVar24 + 0x18;
        uVar21 = uVar21 + (ulong)(-1 < (int)uVar32) * 2 + -1;
        lVar38 = lVar38 + 0x60;
        lVar41 = lVar41 + 0x60;
      } while (uVar24 < uVar32 * 0x18 + 0x198);
      fVar2 = gauss_s2_arr[lVar26];
      auVar11._4_4_ = fVar2;
      auVar11._0_4_ = fVar2;
      auVar11._8_4_ = fVar2;
      auVar11._12_4_ = fVar2;
      auVar49 = vmulps_avx512vl(auVar70,auVar11);
      lVar26 = lVar26 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar27) = auVar49;
      auVar73._0_4_ = auVar49._0_4_ * auVar49._0_4_;
      auVar73._4_4_ = auVar49._4_4_ * auVar49._4_4_;
      auVar73._8_4_ = auVar49._8_4_ * auVar49._8_4_;
      auVar73._12_4_ = auVar49._12_4_ * auVar49._12_4_;
      auVar45 = vmovshdup_avx(auVar73);
      auVar46 = vfmadd231ss_fma(auVar45,auVar49,auVar49);
      auVar45 = vshufpd_avx(auVar49,auVar49,1);
      auVar46 = vfmadd213ss_fma(auVar45,auVar45,auVar46);
      auVar45 = vshufps_avx(auVar49,auVar49,0xff);
      auVar45 = vfmadd213ss_fma(auVar45,auVar45,auVar46);
      fVar63 = fVar63 + auVar45._0_4_;
      lVar27 = lVar27 + 4;
      uVar32 = uVar32 + 5;
      uVar28 = uVar28 + 0x78;
      lVar33 = lVar33 + 0x1e0;
      lVar25 = lVar25 + 0x1e0;
    } while (iVar39 + 4 != (int)lVar26);
    lVar19 = lVar19 + 0x14;
    uVar20 = (ulong)(uVar18 + 5);
  } while ((int)uVar18 < 3);
  if (fVar63 < 0.0) {
    fVar63 = sqrtf(fVar63);
  }
  else {
    auVar45 = vsqrtss_avx(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63));
    fVar63 = auVar45._0_4_;
  }
  auVar93 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar63)));
  lVar19 = 0;
  do {
    auVar60 = vmulps_avx512f(auVar93,*(undefined1 (*) [64])(ipoint->descriptor + lVar19));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar19) = auVar60;
    lVar19 = lVar19 + 0x10;
  } while (lVar19 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_1_12_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=12, k_count+=12) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                float ipoint_x_sub_int_scale_add_k8_mul_scale = ipoint_x_sub_int_scale + k8 * scale;
                float ipoint_x_sub_int_scale_add_k9_mul_scale = ipoint_x_sub_int_scale + k9 * scale;
                float ipoint_x_sub_int_scale_add_k10_mul_scale = ipoint_x_sub_int_scale + k10 * scale;
                float ipoint_x_sub_int_scale_add_k11_mul_scale = ipoint_x_sub_int_scale + k11 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_k6_mul_scale + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_k7_mul_scale + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_k8_mul_scale + (ipoint_x_sub_int_scale_add_k8_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_k9_mul_scale + (ipoint_x_sub_int_scale_add_k9_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_k10_mul_scale + (ipoint_x_sub_int_scale_add_k10_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_k11_mul_scale + (ipoint_x_sub_int_scale_add_k11_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);

            for (int k=-12, k_count=0; k<12; k+=12, k_count+=12) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);
                int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_05 + k8 * scale);
                int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_05 + k9 * scale);
                int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_05 + k10 * scale);
                int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_05 + k11 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}